

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O3

void re2::RegexpBigConcat(void)

{
  size_t __n;
  undefined1 *puVar1;
  int iVar2;
  Regexp *this;
  Regexp **sub;
  Regexp *this_00;
  Regexp *__tmp;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  char *local_1a0 [46];
  
  local_1b0._0_8_ = "x";
  local_1b0._8_4_ = 1;
  lVar3 = 0;
  this = Regexp::Parse((StringPiece *)local_1b0,NoParseFlags,(RegexpStatus *)0x0);
  sub = (Regexp **)operator_new(720000);
  auVar5._8_4_ = (int)this;
  auVar5._0_8_ = this;
  auVar5._12_4_ = (int)((ulong)this >> 0x20);
  do {
    *(undefined1 (*) [16])(sub + lVar3) = auVar5;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 90000);
  lVar3 = 90000;
  do {
    Regexp::Incref(this);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  iVar2 = Regexp::Ref(this);
  if (iVar2 != 0x15f91) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x22,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Check failed: (x->Ref()) == (1 + static_cast<int>(v.size()))",0x3c);
    iVar2 = Regexp::Ref(this);
    std::ostream::operator<<((ostream *)(local_1b0 + 8),iVar2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  this_00 = Regexp::Concat(sub,90000,NoParseFlags);
  Regexp::ToString_abi_cxx11_((string *)local_1b0,this_00);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,-0x70);
  puVar1 = local_1d0;
  __n = CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
  if (__n == local_1c8) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp((void *)local_1b0._0_8_,local_1d0,__n);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (puVar1 != local_1c0) {
    operator_delete(puVar1);
  }
  if ((char **)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if (!bVar4) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x25,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Check failed: (re->ToString()) == (string(v.size(), \'x\'))",0x39);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  Regexp::Decref(this_00);
  iVar2 = Regexp::Ref(this);
  if (iVar2 != 1) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x27,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Check failed: (x->Ref()) == (1)",0x1f);
    iVar2 = Regexp::Ref(this);
    std::ostream::operator<<((ostream *)(local_1b0 + 8),iVar2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  Regexp::Decref(this);
  operator_delete(sub);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}